

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
extract_attr_string(exr_context_t ctxt,_internal_exr_seq_scratch *scratch,
                   exr_attr_string_t *attrdata,char *aname,char *tname,int32_t attrsz,char *strptr)

{
  int iVar1;
  char *in_RCX;
  exr_attr_string_t *in_RDX;
  exr_context_t in_RSI;
  long in_RDI;
  undefined8 in_R8;
  int in_R9D;
  exr_result_t rv;
  exr_result_t local_4;
  
  iVar1 = (*(code *)(in_RSI->tmp_filename).str)(in_RSI,tname,(long)in_R9D);
  if (iVar1 == 0) {
    tname[in_R9D] = '\0';
    local_4 = exr_attr_string_init_static_with_length
                        (in_RSI,in_RDX,in_RCX,(int32_t)((ulong)in_R8 >> 0x20));
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,iVar1,"Unable to read \'%s\' %s data",in_RCX,in_R8);
  }
  return local_4;
}

Assistant:

static exr_result_t
extract_attr_string (
    exr_context_t                     ctxt,
    struct _internal_exr_seq_scratch* scratch,
    exr_attr_string_t*                attrdata,
    const char*                       aname,
    const char*                       tname,
    int32_t                           attrsz,
    char*                             strptr)
{
    exr_result_t rv =
        scratch->sequential_read (scratch, (void*) strptr, (uint64_t) attrsz);

    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt, rv, "Unable to read '%s' %s data", aname, tname);

    strptr[attrsz] = '\0';

    return exr_attr_string_init_static_with_length (
        ctxt, attrdata, strptr, attrsz);
}